

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O3

Token * __thiscall inja::Lexer::scan_id(Token *__return_storage_ptr__,Lexer *this)

{
  byte bVar1;
  const_pointer pcVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  pcVar2 = (this->m_in).data_;
  uVar3 = (this->m_in).size_;
  uVar5 = this->m_pos;
  uVar6 = uVar5;
  if (uVar5 < uVar3) {
    do {
      bVar1 = pcVar2[uVar5];
      iVar4 = isalnum((int)(char)bVar1);
      if (((iVar4 == 0) && (2 < bVar1 - 0x2d)) && (uVar6 = uVar5, bVar1 != 0x5f)) break;
      uVar5 = uVar5 + 1;
      this->m_pos = uVar5;
      uVar6 = uVar3;
    } while (uVar3 != uVar5);
  }
  uVar5 = this->m_tok_start;
  if (uVar3 < this->m_tok_start) {
    uVar5 = uVar3;
  }
  if (uVar6 < uVar5) {
    uVar6 = uVar5;
  }
  if (uVar3 <= uVar6) {
    uVar6 = uVar3;
  }
  local_40.data_ = pcVar2;
  local_40.size_ = uVar3;
  bVar7 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                    (&local_40,uVar5,uVar6 - uVar5);
  __return_storage_ptr__->kind = Id;
  (__return_storage_ptr__->text).data_ = bVar7.data_;
  (__return_storage_ptr__->text).size_ = bVar7.size_;
  return __return_storage_ptr__;
}

Assistant:

Token scan_id() {
		for (;;) {
			if (m_pos >= m_in.size()) {
				break;
			}
			char ch = m_in[m_pos];
			if (!std::isalnum(ch) && ch != '.' && ch != '/' && ch != '_' && ch != '-') {
				break;
			}
			m_pos += 1;
		}
		return make_token(Token::Kind::Id);
	}